

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void __thiscall
btSoftBody::appendTetra(btSoftBody *this,int node0,int node1,int node2,int node3,Material *mat)

{
  int iVar1;
  Tetra *pTVar2;
  Node *pNVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  btScalar bVar4;
  btVector3 *in_stack_00000008;
  Tetra *t;
  Material *in_stack_00000060;
  int in_stack_0000006c;
  btSoftBody *in_stack_00000070;
  
  appendTetra(in_stack_00000070,in_stack_0000006c,in_stack_00000060);
  iVar1 = btAlignedObjectArray<btSoftBody::Tetra>::size
                    ((btAlignedObjectArray<btSoftBody::Tetra> *)(in_RDI + 0x3d0));
  pTVar2 = btAlignedObjectArray<btSoftBody::Tetra>::operator[]
                     ((btAlignedObjectArray<btSoftBody::Tetra> *)(in_RDI + 0x3d0),iVar1 + -1);
  pNVar3 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                     ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),in_ESI);
  pTVar2->m_n[0] = pNVar3;
  pNVar3 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                     ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),in_EDX);
  pTVar2->m_n[1] = pNVar3;
  pNVar3 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                     ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),in_ECX);
  pTVar2->m_n[2] = pNVar3;
  pNVar3 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                     ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),in_R8D);
  pTVar2->m_n[3] = pNVar3;
  bVar4 = VolumeOf((btVector3 *)CONCAT44(node2,node3),(btVector3 *)mat,(btVector3 *)t,
                   in_stack_00000008);
  pTVar2->m_rv = bVar4;
  *(undefined1 *)(in_RDI + 0x4b4) = 1;
  return;
}

Assistant:

void			btSoftBody::appendTetra(int node0,
										int node1,
										int node2,
										int node3,
										Material* mat)
{
	appendTetra(-1,mat);
	Tetra&	t=m_tetras[m_tetras.size()-1];
	t.m_n[0]	=	&m_nodes[node0];
	t.m_n[1]	=	&m_nodes[node1];
	t.m_n[2]	=	&m_nodes[node2];
	t.m_n[3]	=	&m_nodes[node3];
	t.m_rv		=	VolumeOf(t.m_n[0]->m_x,t.m_n[1]->m_x,t.m_n[2]->m_x,t.m_n[3]->m_x);
	m_bUpdateRtCst=true;
}